

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

Node * __thiscall Patch::splay_node_starting_before<Patch::NewCoordinates>(Patch *this,Point target)

{
  pointer ppNVar1;
  bool bVar2;
  Point PVar3;
  Node *pNVar4;
  size_type __new_size;
  Point left_ancestor_end;
  Point node_start;
  Node *local_68;
  Node *local_60;
  vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *local_58;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  local_38 = target;
  Point::Point(&local_48);
  local_68 = this->root;
  ppNVar1 = (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar1) {
    (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar1;
  }
  local_58 = &this->node_stack;
  __new_size = 0;
  local_60 = (Node *)0x0;
  for (; pNVar4 = local_60, local_68 != (Node *)0x0; local_68 = local_68->left) {
    local_50 = local_68->new_distance_from_left_ancestor;
    local_40 = Point::traverse(&local_48,&local_50);
    local_50 = local_68->new_extent;
    PVar3 = Point::traverse(&local_40,&local_50);
    bVar2 = Point::operator<=(&local_40,&local_38);
    pNVar4 = local_68;
    if (bVar2) {
      __new_size = (long)(this->node_stack).
                         super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->node_stack).
                         super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
      if (local_68->right == (Node *)0x0) break;
      local_48 = PVar3;
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back(local_58,&local_68);
      local_68 = (Node *)&local_68->right;
      local_60 = pNVar4;
    }
    else {
      pNVar4 = local_60;
      if (local_68->left == (Node *)0x0) break;
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back(local_58,&local_68);
    }
  }
  if (pNVar4 != (Node *)0x0) {
    std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::resize(local_58,__new_size);
    splay_node(this,pNVar4);
  }
  return pNVar4;
}

Assistant:

Patch::Node *Patch::splay_node_starting_before(Point target) {
  Node *splayed_node = nullptr;
  Point left_ancestor_end = Point();
  Node *node = root;

  node_stack.clear();
  size_t splayed_node_ancestor_count = 0;
  while (node) {
    Point node_start = left_ancestor_end.traverse(
        CoordinateSpace::distance_from_left_ancestor(node));
    Point node_end = node_start.traverse(CoordinateSpace::extent(node));
    if (node_start <= target) {
      splayed_node = node;
      splayed_node_ancestor_count = node_stack.size();
      if (node->right) {
        left_ancestor_end = node_end;
        node_stack.push_back(node);
        node = node->right;
      } else {
        break;
      }
    } else {
      if (node->left) {
        node_stack.push_back(node);
        node = node->left;
      } else {
        break;
      }
    }
  }

  if (splayed_node) {
    node_stack.resize(splayed_node_ancestor_count);
    splay_node(splayed_node);
  }

  return splayed_node;
}